

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert-expr.c
# Opt level: O3

void exprnode_free(ExprNode *en)

{
  ulong uVar1;
  
  switch(en->op) {
  case OP_AND:
  case OP_OR:
    if ((en->field_2).field_0.nsubexprs != 0) {
      uVar1 = 0;
      do {
        exprnode_free((en->field_2).field_0.subexprs[uVar1]);
        uVar1 = uVar1 + 1;
      } while (uVar1 < (en->field_2).field_0.nsubexprs);
    }
  case OP_HOSTNAME_WC:
    safefree((en->field_2).field_0.subexprs);
    break;
  case OP_NOT:
    exprnode_free((ExprNode *)(en->field_2).field_0.subexprs);
    break;
  case OP_PORT_RANGE:
    break;
  default:
    __assert_fail("false && \"unhandled node type in exprnode_free\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/cert-expr.c"
                  ,0x148,"void exprnode_free(ExprNode *)");
  }
  safefree(en);
  return;
}

Assistant:

static void exprnode_free(ExprNode *en)
{
    switch (en->op) {
      case OP_AND:
      case OP_OR:
        for (size_t i = 0; i < en->nsubexprs; i++)
            exprnode_free(en->subexprs[i]);
        sfree(en->subexprs);
        break;
      case OP_NOT:
        exprnode_free(en->subexpr);
        break;
      case OP_HOSTNAME_WC:
        sfree(en->wc);
        break;
      case OP_PORT_RANGE:
        break;
      default:
        unreachable("unhandled node type in exprnode_free");
    }

    sfree(en);
}